

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O1

void __thiscall iqxmlrpc::Value::Value(Value *this,string *s)

{
  pointer pcVar1;
  Value_type *pVVar2;
  
  this->_vptr_Value = (_func_int **)&PTR__Value_0018bad8;
  pVVar2 = (Value_type *)operator_new(0x28);
  pVVar2->_vptr_Value_type = (_func_int **)&PTR__Scalar_0018bcb8;
  pVVar2[1]._vptr_Value_type = (_func_int **)(pVVar2 + 3);
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pVVar2 + 1),pcVar1,pcVar1 + s->_M_string_length);
  this->value = pVVar2;
  return;
}

Assistant:

Value::Value( std::string s ):
  value( new String(s) )
{
}